

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_Test::
TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_Test
          (TEST_MockCallTest_expectOneCallInOneScopeButActualCallInAnotherScope_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockCallTest).super_Utest._vptr_Utest = (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockCallTest::TEST_GROUP_CppUTestGroupMockCallTest
            (&this->super_TEST_GROUP_CppUTestGroupMockCallTest);
  (this->super_TEST_GROUP_CppUTestGroupMockCallTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002de408;
  return;
}

Assistant:

TEST(MockCallTest, expectOneCallInOneScopeButActualCallInAnotherScope)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest emptyExpectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "class::foo", emptyExpectations);

    mock("scope").expectOneCall("foo");
    mock("class").actualCall("foo");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
    mock().clear();
}